

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  char *ptr;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if ((ctx->Tables).Map.Data.Size != 0) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      pIVar1 = (ctx->Tables).Buf.Data;
      lVar4 = (long)*(int *)((long)&((ctx->Tables).Map.Data.Data)->key + lVar2);
      if (pIVar1 != (ImGuiTable *)0x0 && lVar4 != -1) {
        pIVar1[lVar4].SettingsOffset = -1;
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 != (uint)(ctx->Tables).Map.Data.Size);
  }
  ptr = (ctx->SettingsTables).Buf.Data;
  if (ptr != (char *)0x0) {
    (ctx->SettingsTables).Buf.Size = 0;
    (ctx->SettingsTables).Buf.Capacity = 0;
    ImGui::MemFree(ptr);
    (ctx->SettingsTables).Buf.Data = (char *)0x0;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
            table->SettingsOffset = -1;
    g.SettingsTables.clear();
}